

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::attDef
          (AbstractDOMParser *this,DTDElementDecl *elemDecl,DTDAttDef *attDef,bool param_3)

{
  XMLBuffer *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  AttTypes AVar4;
  DefAttTypes DVar5;
  undefined4 extraout_var;
  XMLSize_t XVar6;
  XMLCh *pXVar7;
  XMLCh *defaultValue;
  ulong uStack_40;
  DefAttTypes def;
  XMLSize_t i;
  XMLSize_t length;
  XMLCh *enumString;
  AttTypes type;
  bool param_3_local;
  DTDAttDef *attDef_local;
  DTDElementDecl *elemDecl_local;
  AbstractDOMParser *this_local;
  
  bVar1 = DOMDocumentTypeImpl::isIntSubsetReading(this->fDocumentType);
  if ((bVar1) &&
     (uVar2 = (*(elemDecl->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[7])(),
     (uVar2 & 1) != 0)) {
    this_00 = this->fInternalSubset;
    iVar3 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
    XMLBuffer::append(this_00,(XMLCh *)CONCAT44(extraout_var,iVar3));
    AVar4 = XMLAttDef::getType(&attDef->super_XMLAttDef);
    switch(AVar4) {
    case AttTypes_Min:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgCDATAString);
      break;
    case ID:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L"ID");
      break;
    case IDRef:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgIDRefString);
      break;
    case IDRefs:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgIDRefsString);
      break;
    case Entity:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgEntityString);
      break;
    case Entities:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgEntitiesString);
      break;
    case NmToken:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNmTokenString);
      break;
    case NmTokens:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNmTokensString);
      break;
    case Notation:
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgNotationString);
      break;
    case Enumeration:
      XMLBuffer::append(this->fInternalSubset,L' ');
      pXVar7 = XMLAttDef::getEnumeration(&attDef->super_XMLAttDef);
      XVar6 = XMLString::stringLen(pXVar7);
      if (XVar6 != 0) {
        XMLBuffer::append(this->fInternalSubset,L'(');
        for (uStack_40 = 0; uStack_40 < XVar6; uStack_40 = uStack_40 + 1) {
          if (pXVar7[uStack_40] == L' ') {
            XMLBuffer::append(this->fInternalSubset,L'|');
          }
          else {
            XMLBuffer::append(this->fInternalSubset,pXVar7[uStack_40]);
          }
        }
        XMLBuffer::append(this->fInternalSubset,L')');
      }
    }
    DVar5 = XMLAttDef::getDefaultType(&attDef->super_XMLAttDef);
    if (DVar5 == Fixed) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgFixedString);
    }
    else if (DVar5 == Required) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgRequiredString);
    }
    else if (DVar5 == Implied) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,(XMLCh *)XMLUni::fgImpliedString);
    }
    pXVar7 = XMLAttDef::getValue(&attDef->super_XMLAttDef);
    if (pXVar7 != (XMLCh *)0x0) {
      XMLBuffer::append(this->fInternalSubset,L' ');
      XMLBuffer::append(this->fInternalSubset,L'\"');
      XMLBuffer::append(this->fInternalSubset,pXVar7);
      XMLBuffer::append(this->fInternalSubset,L'\"');
    }
  }
  return;
}

Assistant:

void AbstractDOMParser::attDef
(
    const   DTDElementDecl&     elemDecl
    , const DTDAttDef&          attDef
    , const bool
)
{
    if (fDocumentType->isIntSubsetReading())
    {
        if (elemDecl.hasAttDefs())
        {
            fInternalSubset.append(attDef.getFullName());

            // Get the type and display it
            const XMLAttDef::AttTypes type = attDef.getType();
            switch(type)
            {
            case XMLAttDef::CData :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgCDATAString);
                break;
            case XMLAttDef::ID :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDString);
                break;
            case XMLAttDef::IDRef :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefString);
                break;
            case XMLAttDef::IDRefs :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgIDRefsString);
                break;
            case XMLAttDef::Entity :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntityString);
                break;
            case XMLAttDef::Entities :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgEntitiesString);
                break;
            case XMLAttDef::NmToken :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokenString);
                break;
            case XMLAttDef::NmTokens :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNmTokensString);
                break;

            case XMLAttDef::Notation :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgNotationString);
                break;

            case XMLAttDef::Enumeration :
                {
                    fInternalSubset.append(chSpace);
                    const XMLCh* enumString = attDef.getEnumeration();
                    XMLSize_t length = XMLString::stringLen(enumString);
                    if (length > 0) {

                        fInternalSubset.append(chOpenParen );
                        for(XMLSize_t i=0; i<length; i++) {
                            if (enumString[i] == chSpace)
                                fInternalSubset.append(chPipe);
                            else
                                fInternalSubset.append(enumString[i]);
                        }
                        fInternalSubset.append(chCloseParen);
                    }
                }
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }
            //get te default types of the attlist
            const XMLAttDef::DefAttTypes def = attDef.getDefaultType();
            switch(def)
            {
            case XMLAttDef::Required :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgRequiredString);
                break;
            case XMLAttDef::Implied :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgImpliedString);
                break;
            case XMLAttDef::Fixed :
                fInternalSubset.append(chSpace);
                fInternalSubset.append(XMLUni::fgFixedString);
                break;
            default:
                // remaining types don't belong to a DTD
                break;
            }

            const XMLCh* defaultValue = attDef.getValue();
            if (defaultValue != 0) {
                fInternalSubset.append(chSpace);
                fInternalSubset.append(chDoubleQuote);
                fInternalSubset.append(defaultValue);
                fInternalSubset.append(chDoubleQuote);
            }
        }
    }
}